

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_reader.cpp
# Opt level: O1

ColumnReader * __thiscall
duckdb::StructColumnReader::GetChildReader(StructColumnReader *this,idx_t child_idx)

{
  reference pvVar1;
  InternalException *this_00;
  string local_40;
  
  pvVar1 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
           ::operator[](&this->child_readers,child_idx);
  if ((pvVar1->super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>).
      _M_t.super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
      super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl != (ColumnReader *)0x0) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
             ::operator[](&this->child_readers,child_idx);
    return (pvVar1->
           super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)._M_t.
           super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
           .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "StructColumnReader::GetChildReader(%d) - but this child reader is not set","");
  InternalException::InternalException<unsigned_long>(this_00,&local_40,child_idx);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ColumnReader &StructColumnReader::GetChildReader(idx_t child_idx) {
	if (!child_readers[child_idx]) {
		throw InternalException("StructColumnReader::GetChildReader(%d) - but this child reader is not set", child_idx);
	}
	return *child_readers[child_idx].get();
}